

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::LogRenderedText(ImVec2 *ref_pos,char *text,char *text_end)

{
  int iVar1;
  int iVar2;
  ImGuiWindow *pIVar3;
  bool bVar4;
  ImGuiContext *pIVar5;
  char *in_RDX;
  char *in_RSI;
  long in_RDI;
  int char_count;
  bool is_last_line;
  bool is_first_line;
  char *line_end;
  char *line_start;
  int tree_depth;
  char *text_remaining;
  bool log_new_line;
  ImGuiWindow *window;
  ImGuiContext *g;
  uint in_stack_ffffffffffffffa8;
  undefined2 in_stack_ffffffffffffffac;
  byte in_stack_ffffffffffffffae;
  undefined1 in_stack_ffffffffffffffaf;
  char *in_stack_ffffffffffffffb0;
  char *local_38;
  char *local_18;
  
  pIVar5 = GImGui;
  pIVar3 = GImGui->CurrentWindow;
  local_18 = in_RDX;
  if (in_RDX == (char *)0x0) {
    local_18 = FindRenderedTextEnd(in_RSI,(char *)0x0);
  }
  bVar4 = false;
  if (in_RDI != 0) {
    bVar4 = (pIVar3->DC).LogLinePosY + 1.0 < *(float *)(in_RDI + 4);
    (pIVar3->DC).LogLinePosY = *(float *)(in_RDI + 4);
  }
  if ((pIVar3->DC).TreeDepth < pIVar5->LogStartDepth) {
    pIVar5->LogStartDepth = (pIVar3->DC).TreeDepth;
  }
  iVar1 = (pIVar3->DC).TreeDepth;
  iVar2 = pIVar5->LogStartDepth;
  local_38 = in_RSI;
  while( true ) {
    in_stack_ffffffffffffffb0 =
         ImStreolRange(in_stack_ffffffffffffffb0,
                       (char *)CONCAT17(in_stack_ffffffffffffffaf,
                                        CONCAT16(in_stack_ffffffffffffffae,
                                                 CONCAT24(in_stack_ffffffffffffffac,
                                                          in_stack_ffffffffffffffa8))));
    in_stack_ffffffffffffffaf = local_38 == in_RSI;
    in_stack_ffffffffffffffae = in_stack_ffffffffffffffb0 == local_18;
    if ((!(bool)in_stack_ffffffffffffffae) || (local_38 != in_stack_ffffffffffffffb0)) {
      in_stack_ffffffffffffffa8 = (int)in_stack_ffffffffffffffb0 - (int)local_38;
      if ((bVar4) || (!(bool)in_stack_ffffffffffffffaf)) {
        LogText("\n%*s%.*s",(ulong)(uint)((iVar1 - iVar2) * 4),"",(ulong)in_stack_ffffffffffffffa8,
                local_38);
      }
      else {
        LogText(" %.*s",(ulong)in_stack_ffffffffffffffa8,local_38);
      }
    }
    if ((in_stack_ffffffffffffffae & 1) != 0) break;
    local_38 = in_stack_ffffffffffffffb0 + 1;
  }
  return;
}

Assistant:

void ImGui::LogRenderedText(const ImVec2* ref_pos, const char* text, const char* text_end)
{
    ImGuiContext& g = *GImGui;
    ImGuiWindow* window = g.CurrentWindow;

    if (!text_end)
        text_end = FindRenderedTextEnd(text, text_end);

    const bool log_new_line = ref_pos && (ref_pos->y > window->DC.LogLinePosY + 1);
    if (ref_pos)
        window->DC.LogLinePosY = ref_pos->y;

    const char* text_remaining = text;
    if (g.LogStartDepth > window->DC.TreeDepth)  // Re-adjust padding if we have popped out of our starting depth
        g.LogStartDepth = window->DC.TreeDepth;
    const int tree_depth = (window->DC.TreeDepth - g.LogStartDepth);
    for (;;)
    {
        // Split the string. Each new line (after a '\n') is followed by spacing corresponding to the current depth of our log entry.
        const char* line_start = text_remaining;
        const char* line_end = ImStreolRange(line_start, text_end);
        const bool is_first_line = (line_start == text);
        const bool is_last_line = (line_end == text_end);
        if (!is_last_line || (line_start != line_end))
        {
            const int char_count = (int)(line_end - line_start);
            if (log_new_line || !is_first_line)
                LogText(IM_NEWLINE "%*s%.*s", tree_depth*4, "", char_count, line_start);
            else
                LogText(" %.*s", char_count, line_start);
        }

        if (is_last_line)
            break;
        text_remaining = line_end + 1;
    }
}